

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O0

mFILE * mstdin(void)

{
  mFILE *local_10;
  
  if (m_channel[0] == (mFILE *)0x0) {
    m_channel[0] = mfcreate((char *)0x0,0);
    if (m_channel[0] == (mFILE *)0x0) {
      local_10 = (mFILE *)0x0;
    }
    else {
      m_channel[0]->fp = _stdin;
      local_10 = m_channel[0];
    }
  }
  else {
    local_10 = m_channel[0];
  }
  return local_10;
}

Assistant:

mFILE *mstdin(void) {
    if (m_channel[0])
	return m_channel[0];

    m_channel[0] = mfcreate(NULL, 0);
    if (NULL == m_channel[0]) return NULL;
    m_channel[0]->fp = stdin;
    return m_channel[0];
}